

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0> *
__thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_dwo_name_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           *__return_storage_ptr__,dwarf_resolver *this,die_object *cu_die)

{
  bool bVar1;
  undefined1 local_80 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  dwo_name_1;
  undefined1 local_48 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  dwo_name;
  die_object *cu_die_local;
  dwarf_resolver *this_local;
  
  dwo_name._32_8_ = cu_die;
  die_object::get_string_attribute_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              *)local_48,cu_die,0x2130);
  bVar1 = detail::optional::operator_cast_to_bool((optional *)local_48);
  if (bVar1) {
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
    optional(__return_storage_ptr__,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              *)local_48);
    dwo_name_1.holds_value = true;
    dwo_name_1._33_3_ = 0;
  }
  else {
    die_object::get_string_attribute_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                *)local_80,(die_object *)dwo_name._32_8_,0x76);
    bVar1 = detail::optional::operator_cast_to_bool((optional *)local_80);
    if (bVar1) {
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
      optional(__return_storage_ptr__,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                *)local_80);
    }
    else {
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
      optional(__return_storage_ptr__);
    }
    dwo_name_1.holds_value = true;
    dwo_name_1._33_3_ = 0;
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
               *)local_80);
  }
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
             *)local_48);
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> get_dwo_name(const die_object& cu_die) {
            if(auto dwo_name = cu_die.get_string_attribute(DW_AT_GNU_dwo_name)) {
                return dwo_name;
            } else if(auto dwo_name = cu_die.get_string_attribute(DW_AT_dwo_name)) {
                return dwo_name;
            } else {
                return nullopt;
            }
        }